

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav_read_pcm_frames_s16be
                    (ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int16 *pBufferOut)

{
  ushort uVar1;
  ushort uVar2;
  ma_uint64 mVar3;
  ma_dr_wav *in_RDX;
  long in_RDI;
  ma_uint64 framesRead;
  ma_uint64 iSample;
  ma_int16 *in_stack_ffffffffffffffb8;
  ma_uint64 in_stack_ffffffffffffffc0;
  ulong local_20;
  
  mVar3 = ma_dr_wav_read_pcm_frames_s16(in_RDX,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (in_RDX != (ma_dr_wav *)0x0) {
    uVar1 = *(ushort *)(in_RDI + 0x70);
    for (local_20 = 0; local_20 < mVar3 * uVar1; local_20 = local_20 + 1) {
      uVar2 = *(ushort *)((in_RDX->fmt).subFormat + local_20 * 2 + -0x5c);
      *(ushort *)((in_RDX->fmt).subFormat + local_20 * 2 + -0x5c) = uVar2 << 8 | uVar2 >> 8;
    }
  }
  return mVar3;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_s16be(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int16* pBufferOut)
{
    ma_uint64 framesRead = ma_dr_wav_read_pcm_frames_s16(pWav, framesToRead, pBufferOut);
    if (pBufferOut != NULL && ma_dr_wav__is_little_endian() == MA_TRUE) {
        ma_dr_wav__bswap_samples_s16(pBufferOut, framesRead*pWav->channels);
    }
    return framesRead;
}